

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
stringToUnits_parentheticalModifier_Test::stringToUnits_parentheticalModifier_Test
          (stringToUnits_parentheticalModifier_Test *this)

{
  stringToUnits_parentheticalModifier_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__stringToUnits_parentheticalModifier_Test_002fa300;
  return;
}

Assistant:

TEST(stringToUnits, parentheticalModifier)
{
    auto u1 = unit_from_string("mile(statute)");
    EXPECT_EQ(u1, precise::us::mile);
    auto u2 = unit_from_string("mile (statute)");
    EXPECT_EQ(u2, precise::us::mile);
    auto u3 = unit_from_string("British thermal unit (thermochemical)");
    EXPECT_EQ(u3, precise::energy::btu_th);
    auto u4 = unit_from_string("short(US) ton per day");
    EXPECT_EQ(u4, precise::av::ton / precise::day);
}